

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

bool __thiscall
OpenSSLWrapper::SslServerContext::SetDhParamFile(SslServerContext *this,char *szDhParamFile)

{
  return true;
}

Assistant:

bool SslServerContext::SetDhParamFile([[maybe_unused]] const char* const szDhParamFile)
    {
#if OPENSSL_VERSION_NUMBER < 0x30000000L
        fstream fin(szDhParamFile, ios::in | ios::binary);
        if (fin.is_open() == true)
        {
            fin.seekg(0, ios::end);
            const streamoff nFileSize = fin.tellg();
            fin.seekg(0, ios::beg);

            auto pFileBuf = vector<char>(nFileSize);
            fin.read(&pFileBuf[0], nFileSize);
            fin.close();

            BIO* rbio = BIO_new(BIO_s_mem());
            BIO_write(rbio, &pFileBuf[0], static_cast<int>(nFileSize));

            DH* pDhParam = PEM_read_bio_DHparams(rbio, nullptr, nullptr, nullptr);
            BIO_free(rbio);

            if (SSL_CTX_set_tmp_dh(m_ctx, pDhParam) == 1)
                return true;
        }

        return false;
#else
        return true;
#endif
    }